

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O0

void opj_tgt_setvalue(opj_tgt_tree_t *tree,OPJ_UINT32 leafno,OPJ_INT32 value)

{
  bool bVar1;
  opj_tgt_node_t *local_20;
  opj_tgt_node_t *node;
  OPJ_INT32 value_local;
  OPJ_UINT32 leafno_local;
  opj_tgt_tree_t *tree_local;
  
  local_20 = tree->nodes + leafno;
  while( true ) {
    bVar1 = false;
    if (local_20 != (opj_tgt_node_t *)0x0) {
      bVar1 = value < local_20->value;
    }
    if (!bVar1) break;
    local_20->value = value;
    local_20 = local_20->parent;
  }
  return;
}

Assistant:

void opj_tgt_setvalue(opj_tgt_tree_t *tree, OPJ_UINT32 leafno, OPJ_INT32 value)
{
    opj_tgt_node_t *node;
    node = &tree->nodes[leafno];
    while (node && node->value > value) {
        node->value = value;
        node = node->parent;
    }
}